

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O1

float anon_unknown.dwarf_112d7f::drand(void)

{
  float fVar1;
  
  if ((anonymous_namespace)::drand()::generator == '\0') {
    _GLOBAL__N_1::drand();
  }
  if ((anonymous_namespace)::drand()::distribution == '\0') {
    _GLOBAL__N_1::drand();
  }
  fVar1 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&drand::generator);
  return fVar1 * _ZZN12_GLOBAL__N_15drandEvE12distribution_1 + 0.0;
}

Assistant:

float
drand ()
{
    static std::default_random_engine            generator;
    static std::uniform_real_distribution<float> distribution (0.0f, 1.0f);
    float                                        r = distribution (generator);
    return r;
}